

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::RegisterMulticastListener
          (Error *__return_storage_ptr__,CommissionerApp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,Seconds aTimeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar8;
  string_view fmt;
  format_args args;
  format_args args_00;
  uint8_t status;
  writer write;
  byte local_c9;
  string *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  string local_b8;
  undefined1 local_98 [8];
  char *local_90;
  size_t local_88;
  char local_80 [8];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  parse_func local_70 [1];
  ErrorCode local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  writer local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = (string *)&__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar5 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar5 == '\0') {
    local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffff00000000);
    local_90 = "the commissioner is not active";
    local_88 = 0x1e;
    local_80 = (char  [8])0x0;
    local_70[0] = (parse_func)0x0;
    pcVar7 = "the commissioner is not active";
    local_78 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98;
    do {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98);
      }
      pcVar7 = pcVar6;
    } while (pcVar6 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)0x24ee20,(string_view)ZEXT816(0x1e),args_00);
    local_60 = kInvalidState;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_60;
  }
  else {
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0 = paVar1;
    (*peVar3->_vptr_Commissioner[0x32])
              ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98,peVar3,&local_c9,aMulticastAddrList,aTimeout.__r & 0xffffffff);
    __return_storage_ptr__->mCode = local_98._0_4_;
    std::__cxx11::string::operator=(this_00,(string *)&local_90);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    if (local_c9 == 0) {
      return __return_storage_ptr__;
    }
    local_98._0_4_ = uint_type;
    pcVar7 = "request was rejected with statusCode={}";
    local_90 = "request was rejected with statusCode={}";
    local_88 = 0x27;
    local_80 = (char  [8])0x100000000;
    local_70[0] = ::fmt::v10::detail::
                  parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
    local_c8 = this_00;
    local_78 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98;
    local_38.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_98;
    do {
      if (pcVar7 == "") break;
      pcVar6 = pcVar7;
      if (*pcVar7 == '{') {
LAB_001b265e:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
        ::writer::operator()(&local_38,pcVar7,pcVar6);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98);
        bVar8 = true;
      }
      else {
        pcVar6 = pcVar7 + 1;
        bVar8 = pcVar6 != "";
        if (bVar8) {
          if (*pcVar6 != '{') {
            pcVar4 = pcVar7 + 2;
            do {
              pcVar6 = pcVar4;
              bVar8 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001b265a;
              pcVar4 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar8 = true;
        }
LAB_001b265a:
        if (bVar8) goto LAB_001b265e;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
        ::writer::operator()(&local_38,pcVar7,"");
        bVar8 = false;
      }
    } while (bVar8);
    this_00 = local_c8;
    local_98 = (undefined1  [8])(ulong)local_c9;
    fmt.size_ = 2;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"request was rejected with statusCode={}",fmt,args);
    local_60 = kRejected;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_60;
  }
  std::__cxx11::string::operator=(this_00,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::RegisterMulticastListener(const std::vector<std::string> &aMulticastAddrList, Seconds aTimeout)
{
    Error   error;
    uint8_t status;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->RegisterMulticastListener(status, aMulticastAddrList, aTimeout.count()));
    VerifyOrExit(status == kMlrStatusSuccess,
                 error = ERROR_REJECTED("request was rejected with statusCode={}", status));

exit:
    return error;
}